

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynFor * ParseFor(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynVariableDefinitions *pSVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  SynBase *pSVar5;
  SynBase *local_58;
  SynBase *body;
  SynBase *node_2;
  SynBase *increment;
  SynBase *condition;
  SynBase *node_1;
  SynBase *node;
  SynBase *initializer;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_for);
  if (bVar1) {
    anon_unknown.dwarf_104b6::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'for\'");
    node = (SynBase *)0x0;
    bVar1 = ParseContext::At(ctx,lex_ofigure);
    if (bVar1) {
      pSVar2 = (SynVariableDefinitions *)ParseBlock(ctx);
      anon_unknown.dwarf_104b6::CheckConsume
                (ctx,lex_semicolon,"ERROR: \';\' not found after initializer in \'for\'");
    }
    else {
      pSVar2 = ParseVariableDefinitions(ctx,false);
      if (pSVar2 == (SynVariableDefinitions *)0x0) {
        pSVar2 = (SynVariableDefinitions *)ParseAssignment(ctx);
        if (pSVar2 == (SynVariableDefinitions *)0x0) {
          bVar1 = ParseContext::Consume(ctx,lex_semicolon);
          pSVar2 = (SynVariableDefinitions *)node;
          if (!bVar1) {
            pLVar3 = ParseContext::Current(ctx);
            anon_unknown.dwarf_104b6::Report
                      (ctx,pLVar3,"ERROR: \';\' not found after initializer in \'for\'");
          }
        }
        else {
          anon_unknown.dwarf_104b6::CheckConsume
                    (ctx,lex_semicolon,"ERROR: \';\' not found after initializer in \'for\'");
        }
      }
    }
    node = &pSVar2->super_SynBase;
    increment = ParseAssignment(ctx);
    if (increment == (SynBase *)0x0) {
      pLVar3 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report(ctx,pLVar3,"ERROR: condition not found in \'for\' statement")
      ;
      increment = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar3 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)increment,pLVar3,pLVar4);
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after condition in \'for\'");
    node_2 = (SynBase *)0x0;
    bVar1 = ParseContext::At(ctx,lex_ofigure);
    if (bVar1) {
      node_2 = &ParseBlock(ctx)->super_SynBase;
    }
    else {
      pSVar5 = ParseAssignment(ctx);
      if (pSVar5 != (SynBase *)0x0) {
        node_2 = pSVar5;
      }
    }
    anon_unknown.dwarf_104b6::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' not found after \'for\' statement");
    local_58 = ParseExpression(ctx);
    if (local_58 == (SynBase *)0x0) {
      pLVar3 = ParseContext::Current(ctx);
      anon_unknown.dwarf_104b6::Report(ctx,pLVar3,"ERROR: body not found after \'for\' header");
      local_58 = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar3 = ParseContext::Current(ctx);
      pLVar4 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)local_58,pLVar3,pLVar4);
    }
    ctx_local = (ParseContext *)ParseContext::get<SynFor>(ctx);
    pLVar3 = ParseContext::Previous(ctx);
    SynFor::SynFor((SynFor *)ctx_local,begin,pLVar3,node,increment,node_2,local_58);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynFor *)ctx_local;
}

Assistant:

SynFor* ParseFor(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_for))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'for'");

		SynBase *initializer = NULL;

		if(ctx.At(lex_ofigure))
		{
			initializer = ParseBlock(ctx);

			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after initializer in 'for'");
		}
		else if(SynBase *node = ParseVariableDefinitions(ctx, false))
		{
			initializer = node;
		}
		else if(SynBase *node = ParseAssignment(ctx))
		{
			initializer = node;

			CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after initializer in 'for'");
		}
		else if(!ctx.Consume(lex_semicolon))
		{
			Report(ctx, ctx.Current(), "ERROR: ';' not found after initializer in 'for'");
		}

		SynBase *condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'for' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after condition in 'for'");

		SynBase *increment = NULL;

		if(ctx.At(lex_ofigure))
			increment = ParseBlock(ctx);
		else if(SynBase *node = ParseAssignment(ctx))
			increment = node;

		CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after 'for' statement");

		SynBase *body = ParseExpression(ctx);

		if(!body)
		{
			Report(ctx, ctx.Current(), "ERROR: body not found after 'for' header");

			body = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynFor>()) SynFor(start, ctx.Previous(), initializer, condition, increment, body);
	}

	return NULL;
}